

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linearizer.c
# Opt level: O0

void instruct_close(Proc *proc,BasicBlock *block,Scope *scope,uint line_number)

{
  BasicBlock *pBVar1;
  _Bool _Var2;
  Instruction *insn_00;
  Instruction *insn;
  PtrListIterator symboliter__;
  LuaSymbol *symbol;
  BasicBlock *prev_current;
  uint line_number_local;
  Scope *scope_local;
  BasicBlock *block_local;
  Proc *proc_local;
  
  _Var2 = is_already_closed(proc,block);
  if (!_Var2) {
    pBVar1 = proc->current_bb;
    proc->current_bb = block;
    raviX_ptrlist_forward_iterator((PtrListIterator *)&insn,(PtrList *)scope->symbol_list);
    symboliter__._16_8_ = raviX_ptrlist_iter_next((PtrListIterator *)&insn);
    while (symboliter__._16_8_ != 0) {
      if ((*(int *)symboliter__._16_8_ == 0) && ((*(byte *)(symboliter__._16_8_ + 0x30) & 1) != 0))
      {
        if (*(long *)(symboliter__._16_8_ + 0x38) == 0) {
          __assert_fail("symbol->variable.pseudo",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/ravicomp/src/linearizer.c"
                        ,0x928,"void instruct_close(Proc *, BasicBlock *, Scope *, unsigned int)");
        }
        insn_00 = allocate_instruction(proc,op_close,line_number);
        add_instruction_operand(proc,insn_00,*(Pseudo **)(symboliter__._16_8_ + 0x38));
        add_instruction(proc,insn_00);
        break;
      }
      symboliter__._16_8_ = raviX_ptrlist_iter_next((PtrListIterator *)&insn);
    }
    proc->current_bb = pBVar1;
  }
  return;
}

Assistant:

static void instruct_close(Proc *proc, BasicBlock *block, Scope *scope, unsigned line_number)
{
	if (is_already_closed(proc, block))
		return;
	/* temporarily make block current */
	BasicBlock *prev_current = proc->current_bb;
	proc->current_bb = block;

	LuaSymbol *symbol;
	FOR_EACH_PTR(scope->symbol_list, LuaSymbol, symbol)
	{
		/* We add the first escaping variable as the operand to op_close.
		 * op_close is meant to scan the stack from that point and close
		 * any open upvalues
		 */
		if (symbol->symbol_type == SYM_LOCAL && symbol->variable.escaped) {
			assert(symbol->variable.pseudo);
			Instruction *insn = allocate_instruction(proc, op_close, line_number);
			add_instruction_operand(proc, insn, symbol->variable.pseudo);
			add_instruction(proc, insn);
			break;
		}
	}
	END_FOR_EACH_PTR(symbol)
	
	/* restore current basic block */
	proc->current_bb = prev_current;
}